

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver_cluster.hpp
# Opt level: O3

vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
* treecut_ratio(vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                *__return_storage_ptr__,SphereTree *hierarchy,vec3f cluster_center,
               float cluster_radius,float angle_limit,float detailed_angle_limit)

{
  long lVar1;
  pointer pSVar2;
  undefined1 auVar3 [16];
  pointer pfVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  SH<15> *__return_storage_ptr___00;
  pointer pSVar8;
  SH<15> *__return_storage_ptr___01;
  value_type *__val;
  uint uVar9;
  float fVar10;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar11;
  float fVar12;
  float fVar13;
  vec3f cluster_center_00;
  vec3f cluster_center_01;
  vec3f cluster_center_02;
  vec3f cluster_center_03;
  initializer_list<Sphere> __l;
  initializer_list<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_> __l_00;
  vector<Sphere,_std::allocator<Sphere>_> detailed;
  vector<Sphere,_std::allocator<Sphere>_> bounding;
  SH<15> fd;
  SH<15> fb;
  allocator_type local_805;
  float local_804;
  float local_800;
  float local_7fc;
  undefined1 local_7f8 [24];
  vector<float,_std::allocator<float>_> local_7e0;
  vector<Sphere,_std::allocator<Sphere>_> local_7c8;
  vector<Sphere,_std::allocator<Sphere>_> local_7b0;
  vector<Sphere,_std::allocator<Sphere>_> local_798;
  vector<Sphere,_std::allocator<Sphere>_> local_780;
  pair<Sphere,_std::vector<float,_std::allocator<float>_>_> local_768;
  undefined1 local_740 [904];
  undefined1 local_3b8 [904];
  
  cluster_center_00.z = cluster_center.z;
  local_7f8._8_4_ = in_XMM0_Dc;
  local_7f8._0_8_ = cluster_center._0_8_;
  local_7f8._12_4_ = in_XMM0_Dd;
  local_804 = detailed_angle_limit;
  if ((hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_800 = (hierarchy->bound).radius;
    local_7fc = angle_limit;
    fVar10 = sinf(angle_limit);
    fVar13 = (hierarchy->bound).center.x - (float)local_7f8._0_4_;
    fVar11 = (hierarchy->bound).center.y - (float)local_7f8._4_4_;
    fVar12 = (hierarchy->bound).center.z - cluster_center_00.z;
    if ((SQRT(fVar12 * fVar12 + fVar13 * fVar13 + fVar11 * fVar11) - cluster_radius) * fVar10 <=
        local_800) {
      (__return_storage_ptr__->
      super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pSVar8 = (hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar2 = (hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pSVar8 == pSVar2) {
        return __return_storage_ptr__;
      }
      do {
        local_3b8._0_4_ = (pSVar8->bound).center.x;
        local_3b8._4_4_ = (pSVar8->bound).center.y;
        local_3b8._8_8_ = *(undefined8 *)&(pSVar8->bound).center.z;
        std::vector<SphereTree,_std::allocator<SphereTree>_>::vector
                  ((vector<SphereTree,_std::allocator<SphereTree>_> *)(local_3b8 + 0x10),
                   &pSVar8->child);
        auVar3 = local_7f8._0_16_;
        cluster_center_03.z = cluster_center_00.z;
        cluster_center_03.x = (data_t)local_7f8._0_4_;
        cluster_center_03.y = (data_t)local_7f8._4_4_;
        local_7f8._0_16_ = auVar3;
        treecut_ratio((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                       *)local_740,(SphereTree *)local_3b8,cluster_center_03,cluster_radius,
                      local_7fc,local_804);
        std::
        vector<std::pair<Sphere,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<Sphere,std::vector<float,std::allocator<float>>>>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::pair<Sphere,std::vector<float,std::allocator<float>>>*,std::vector<std::pair<Sphere,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<Sphere,std::vector<float,std::allocator<float>>>>>>>
                  ((vector<std::pair<Sphere,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<Sphere,std::vector<float,std::allocator<float>>>>>
                    *)__return_storage_ptr__,
                   (__return_storage_ptr__->
                   super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,local_740._0_8_,local_740._8_8_);
        std::
        vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
        ::~vector((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                   *)local_740);
        std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector
                  ((vector<SphereTree,_std::allocator<SphereTree>_> *)(local_3b8 + 0x10));
        pSVar8 = pSVar8 + 1;
      } while (pSVar8 != pSVar2);
      return __return_storage_ptr__;
    }
  }
  local_3b8._0_4_ = (hierarchy->bound).center.x;
  local_3b8._4_4_ = (hierarchy->bound).center.y;
  local_3b8._8_8_ = *(undefined8 *)&(hierarchy->bound).center.z;
  __l._M_len = 1;
  __l._M_array = (iterator)local_3b8;
  std::vector<Sphere,_std::allocator<Sphere>_>::vector(&local_780,__l,(allocator_type *)local_740);
  auVar3 = local_7f8._0_16_;
  cluster_center_00.x = (data_t)local_7f8._0_4_;
  cluster_center_00.y = (data_t)local_7f8._4_4_;
  local_7f8._0_16_ = auVar3;
  treecut(&local_798,hierarchy,cluster_center_00,cluster_radius,local_804);
  pfVar4 = (pointer)operator_new(0x3c);
  local_7e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = pfVar4 + 0xf;
  pfVar4[0xb] = 0.0;
  pfVar4[0xc] = 0.0;
  pfVar4[0xd] = 0.0;
  pfVar4[0xe] = 0.0;
  pfVar4[8] = 0.0;
  pfVar4[9] = 0.0;
  pfVar4[10] = 0.0;
  pfVar4[0xb] = 0.0;
  pfVar4[4] = 0.0;
  pfVar4[5] = 0.0;
  pfVar4[6] = 0.0;
  pfVar4[7] = 0.0;
  pfVar4[0] = 0.0;
  pfVar4[1] = 0.0;
  pfVar4[2] = 0.0;
  pfVar4[3] = 0.0;
  local_7e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = pfVar4;
  local_7e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_7e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<Sphere,_std::allocator<Sphere>_>::vector(&local_7b0,&local_780);
  auVar3 = local_7f8._0_16_;
  __return_storage_ptr___00 = (SH<15> *)local_3b8;
  cluster_center_01.z = cluster_center_00.z;
  cluster_center_01.x = (data_t)local_7f8._0_4_;
  cluster_center_01.y = (data_t)local_7f8._4_4_;
  local_7f8._0_16_ = auVar3;
  log_visibility(__return_storage_ptr___00,cluster_center_01,&local_7b0);
  if (local_7b0.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_7b0.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<Sphere,_std::allocator<Sphere>_>::vector(&local_7c8,&local_798);
  auVar3 = local_7f8._0_16_;
  __return_storage_ptr___01 = (SH<15> *)local_740;
  cluster_center_02.z = cluster_center_00.z;
  cluster_center_02.x = (data_t)local_7f8._0_4_;
  cluster_center_02.y = (data_t)local_7f8._4_4_;
  local_7f8._0_16_ = auVar3;
  log_visibility(__return_storage_ptr___01,cluster_center_02,&local_7c8);
  if (local_7c8.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_7c8.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  lVar5 = 4;
  lVar6 = 0;
  do {
    lVar1 = lVar6 + 1;
    fVar10 = 0.0;
    fVar11 = 0.0;
    lVar7 = 0;
    do {
      fVar12 = *(float *)((long)__return_storage_ptr___00->a + lVar7);
      fVar10 = fVar10 + fVar12 * *(float *)((long)__return_storage_ptr___01->a + lVar7);
      fVar11 = fVar11 + fVar12 * fVar12;
      lVar7 = lVar7 + 4;
    } while (lVar5 != lVar7);
    uVar9 = -(uint)NAN(fVar10 / fVar11);
    pfVar4[lVar6] = (float)(uVar9 & 0x3f800000 | ~uVar9 & (uint)(fVar10 / fVar11));
    __return_storage_ptr___00 = (SH<15> *)((long)__return_storage_ptr___00->a + lVar5);
    __return_storage_ptr___01 = (SH<15> *)((long)__return_storage_ptr___01->a + lVar5);
    lVar5 = lVar5 + 8;
    lVar6 = lVar1;
  } while (lVar1 != 0xf);
  local_768.first.center.x = (hierarchy->bound).center.x;
  local_768.first.center.y = (hierarchy->bound).center.y;
  local_768.first._8_8_ = *(undefined8 *)&(hierarchy->bound).center.z;
  std::vector<float,_std::allocator<float>_>::vector(&local_768.second,&local_7e0);
  __l_00._M_len = 1;
  __l_00._M_array = &local_768;
  std::
  vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::vector(__return_storage_ptr__,__l_00,&local_805);
  if (local_768.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_768.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_7e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_7e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_798.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_798.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_780.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_780.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<Sphere, std::vector<float>>> treecut_ratio(const SphereTree& hierarchy, vec3f cluster_center, float cluster_radius, float angle_limit, float detailed_angle_limit)
{
	// stop recursing if the blockersphere subtends an angle less than angle_limit
	if (hierarchy.child.empty() || hierarchy.bound.radius < sin(angle_limit) * (norm(hierarchy.bound.center - cluster_center) - cluster_radius))
	{
		std::vector<Sphere> bounding = {hierarchy.bound};
		std::vector<Sphere> detailed = treecut(hierarchy, cluster_center, cluster_radius, detailed_angle_limit);
		std::vector<float> w(shorder);
		SH<shorder> fb = log_visibility(cluster_center, bounding);
		SH<shorder> fd = log_visibility(cluster_center, detailed);
		for (int l=0; l<shorder; ++l) {
			float bd=0, bb=0;
			for (int m=-l; m<=l; ++m) {
				bd += fb.at(l,m) * fd.at(l,m);
				bb += fb.at(l,m) * fb.at(l,m);
			}
			w[l] = bd / bb;
			// replace nan with 1
			if (std::isnan(w[l]))
				w[l] = 1.0f;
		}
		return {{hierarchy.bound, w}};
	}
	std::vector<std::pair<Sphere, std::vector<float>>> res;
	for (auto c: hierarchy.child)
	{
		auto cut = treecut_ratio(c, cluster_center, cluster_radius, angle_limit, detailed_angle_limit);
		res.insert(res.end(), cut.begin(), cut.end());
	}
	return res;
}